

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

bool google::protobuf::util::anon_unknown_0::FieldInOneof
               (Type *type,string_view name,string_view oneof_name)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  Field *this;
  string *this_00;
  string_view name_00;
  Field *field;
  Type *type_local;
  string_view oneof_name_local;
  string_view name_local;
  
  name_00._M_str = (char *)oneof_name._M_len;
  name_00._M_len = name._M_str;
  this = FindField((anon_unknown_0 *)type,(Type *)name._M_len,name_00);
  if ((this != (Field *)0x0) && (iVar2 = Field::oneof_index(this), 0 < iVar2)) {
    iVar2 = Field::oneof_index(this);
    iVar3 = Type::oneofs_size(type);
    if (iVar2 <= iVar3) {
      iVar2 = Field::oneof_index(this);
      this_00 = Type::oneofs_abi_cxx11_(type,iVar2 + -1);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      bVar1 = std::operator==(__x,oneof_name);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool FieldInOneof(const Type& type, absl::string_view name,
                  absl::string_view oneof_name) {
  const Field* field = FindField(type, name);
  if (field == nullptr || field->oneof_index() <= 0 ||
      field->oneof_index() > type.oneofs_size()) {
    return false;
  }
  return type.oneofs(field->oneof_index() - 1) == oneof_name;
}